

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave.c
# Opt level: O0

chunk_conflict * cave_new(wchar_t height,wchar_t width)

{
  chunk_conflict *pcVar1;
  int *piVar2;
  square_conflict **ppsVar3;
  uint16_t **ppuVar4;
  square_conflict *psVar5;
  bitflag *pbVar6;
  uint16_t *puVar7;
  object **ppoVar8;
  monster_conflict *pmVar9;
  monster_group **ppmVar10;
  chunk_conflict *c;
  wchar_t x;
  wchar_t y;
  wchar_t width_local;
  wchar_t height_local;
  
  pcVar1 = (chunk_conflict *)mem_zalloc(0x90);
  pcVar1->height = height;
  pcVar1->width = width;
  piVar2 = (int *)mem_zalloc(0x68);
  pcVar1->feat_count = piVar2;
  ppsVar3 = (square_conflict **)mem_zalloc((long)pcVar1->height << 3);
  pcVar1->squares = ppsVar3;
  ppuVar4 = (uint16_t **)mem_zalloc((long)pcVar1->height << 3);
  (pcVar1->noise).grids = ppuVar4;
  ppuVar4 = (uint16_t **)mem_zalloc((long)pcVar1->height << 3);
  (pcVar1->scent).grids = ppuVar4;
  for (c._4_4_ = 0; c._4_4_ < pcVar1->height; c._4_4_ = c._4_4_ + 1) {
    psVar5 = (square_conflict *)mem_zalloc((long)pcVar1->width * 0x28);
    pcVar1->squares[c._4_4_] = psVar5;
    for (c._0_4_ = 0; (int)c < pcVar1->width; c._0_4_ = (int)c + 1) {
      pbVar6 = (bitflag *)mem_zalloc(3);
      pcVar1->squares[c._4_4_][(int)c].info = pbVar6;
    }
    puVar7 = (uint16_t *)mem_zalloc((long)pcVar1->width << 1);
    (pcVar1->noise).grids[c._4_4_] = puVar7;
    puVar7 = (uint16_t *)mem_zalloc((long)pcVar1->width << 1);
    (pcVar1->scent).grids[c._4_4_] = puVar7;
  }
  ppoVar8 = (object **)mem_zalloc(0x400);
  pcVar1->objects = ppoVar8;
  pcVar1->obj_max = 0x7f;
  pmVar9 = (monster_conflict *)mem_zalloc((ulong)z_info->level_monster_max * 0x1a0);
  pcVar1->monsters = pmVar9;
  pcVar1->mon_max = 1;
  pcVar1->mon_current = L'\xffffffff';
  ppmVar10 = (monster_group **)mem_zalloc((ulong)z_info->level_monster_max << 3);
  pcVar1->monster_groups = ppmVar10;
  pcVar1->turn = turn;
  return pcVar1;
}

Assistant:

struct chunk *cave_new(int height, int width) {
	int y, x;

	struct chunk *c = mem_zalloc(sizeof *c);
	c->height = height;
	c->width = width;
	c->feat_count = mem_zalloc((FEAT_MAX + 1) * sizeof(int));

	c->squares = mem_zalloc(c->height * sizeof(struct square*));
	c->noise.grids = mem_zalloc(c->height * sizeof(uint16_t*));
	c->scent.grids = mem_zalloc(c->height * sizeof(uint16_t*));
	for (y = 0; y < c->height; y++) {
		c->squares[y] = mem_zalloc(c->width * sizeof(struct square));
		for (x = 0; x < c->width; x++) {
			c->squares[y][x].info = mem_zalloc(SQUARE_SIZE * sizeof(bitflag));
		}
		c->noise.grids[y] = mem_zalloc(c->width * sizeof(uint16_t));
		c->scent.grids[y] = mem_zalloc(c->width * sizeof(uint16_t));
	}

	c->objects = mem_zalloc(OBJECT_LIST_SIZE * sizeof(struct object*));
	c->obj_max = OBJECT_LIST_SIZE - 1;

	c->monsters = mem_zalloc(z_info->level_monster_max *sizeof(struct monster));
	c->mon_max = 1;
	c->mon_current = -1;

	c->monster_groups = mem_zalloc(z_info->level_monster_max *
								   sizeof(struct monster_group*));

	c->turn = turn;
	return c;
}